

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O0

bool __thiscall Diligent::VAOCache::VAOHashKey::operator==(VAOHashKey *this,VAOHashKey *Key)

{
  bool bVar1;
  type_conflict Val;
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  Uint32 Slot;
  type_conflict SlotBit;
  Uint32 SlotMask;
  VAOHashKey *Key_local;
  VAOHashKey *this_local;
  
  if ((((this->Hash == Key->Hash) && (this->PsoUId == Key->PsoUId)) &&
      (this->IndexBufferUId == Key->IndexBufferUId)) && (this->UsedSlotsMask == Key->UsedSlotsMask))
  {
    Slot = Key->UsedSlotsMask;
    _SlotBit = Key;
    Key_local = this;
    do {
      if (Slot == 0) {
        return true;
      }
      Val = ExtractLSB<unsigned_int>(&Slot);
      msg.field_2._12_4_ = LinuxMisc::GetLSB(Val);
      if ((this->Streams[(uint)msg.field_2._12_4_].BufferUId < 0) ||
         (_SlotBit->Streams[(uint)msg.field_2._12_4_].BufferUId < 0)) {
        FormatString<char[26],char[65]>
                  ((string *)local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0"
                   ,(char (*) [65])((ulong)(uint)msg.field_2._12_4_ * 0x10));
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"operator==",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xea);
        std::__cxx11::string::~string((string *)local_50);
      }
      bVar1 = StreamAttribs::operator!=
                        (this->Streams + (uint)msg.field_2._12_4_,
                         _SlotBit->Streams + (uint)msg.field_2._12_4_);
    } while (!bVar1);
  }
  return false;
}

Assistant:

bool VAOCache::VAOHashKey::operator==(const VAOHashKey& Key) const noexcept
{
    if (Hash != Key.Hash)
        return false;

    // clang-format off
    if (PsoUId         != Key.PsoUId         ||
        IndexBufferUId != Key.IndexBufferUId ||
        UsedSlotsMask  != Key.UsedSlotsMask)
        return false;
    // clang-format on

    for (auto SlotMask = Key.UsedSlotsMask; SlotMask != 0;)
    {
        const auto SlotBit = ExtractLSB(SlotMask);
        const auto Slot    = PlatformMisc::GetLSB(SlotBit);
        VERIFY_EXPR(Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0);
        if (Streams[Slot] != Key.Streams[Slot])
            return false;
    }

    return true;
}